

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha.h
# Opt level: O0

SHA1 * __thiscall sha1::SHA1::processByte(SHA1 *this,uint8_t octet)

{
  size_t sVar1;
  uint8_t in_SIL;
  SHA1 *in_RDI;
  SHA1 *in_stack_00000170;
  
  sVar1 = in_RDI->m_blockByteIndex;
  in_RDI->m_blockByteIndex = sVar1 + 1;
  in_RDI->m_block[sVar1] = in_SIL;
  in_RDI->m_byteCount = in_RDI->m_byteCount + 1;
  if (in_RDI->m_blockByteIndex == 0x40) {
    in_RDI->m_blockByteIndex = 0;
    processBlock(in_stack_00000170);
  }
  return in_RDI;
}

Assistant:

SHA1 &processByte(uint8_t octet) {
    this->m_block[this->m_blockByteIndex++] = octet;
    ++this->m_byteCount;
    if (m_blockByteIndex == 64) {
      this->m_blockByteIndex = 0;
      processBlock();
    }
    return *this;
  }